

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O0

ssize_t __thiscall amrex::FabSet::read(FabSet *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  ssize_t extraout_RAX;
  int in_stack_000009c0;
  int in_stack_000009c4;
  char *in_stack_000009c8;
  string *in_stack_000009d0;
  FabArray<amrex::FArrayBox> *in_stack_000009d8;
  
  bVar1 = FabArrayBase::empty((FabArrayBase *)0x12f1ebd);
  if (bVar1) {
    Abort_host((char *)this);
  }
  ParallelDescriptor::IOProcessorNumber();
  VisMF::Read(in_stack_000009d8,in_stack_000009d0,in_stack_000009c8,in_stack_000009c4,
              in_stack_000009c0);
  return extraout_RAX;
}

Assistant:

void
FabSet::read(const std::string& name)
{
    if (m_mf.empty()) {
        amrex::Abort("FabSet::read: not predefined");
    }
    VisMF::Read(m_mf,name);
}